

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_kqueue.c
# Opt level: O0

void us_poll_stop(us_poll_t *p,us_loop_t *loop)

{
  us_loop_t *in_RSI;
  us_poll_t *in_RDI;
  epoll_event event;
  int new_events;
  int old_events;
  epoll_event local_24;
  int local_14;
  us_loop_t *local_10;
  us_poll_t *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_14 = us_poll_events(in_RDI);
  local_24.data.u64._4_4_ = 0;
  epoll_ctl(local_10->fd,2,((int)local_8->state << 4) >> 4,&local_24);
  us_internal_loop_update_pending_ready_polls
            (local_10,local_8,(us_poll_t *)0x0,local_14,local_24.data.u64._4_4_);
  return;
}

Assistant:

void us_poll_stop(struct us_poll_t *p, struct us_loop_t *loop) {
    int old_events = us_poll_events(p);
    int new_events = 0;
#ifdef LIBUS_USE_EPOLL
    struct epoll_event event;
    epoll_ctl(loop->fd, EPOLL_CTL_DEL, p->state.fd, &event);
#else
    if (old_events) {
        kqueue_change(loop->fd, p->state.fd, old_events, new_events, NULL);
    }
#endif

    /* Disable any instance of us in the pending ready poll list */
    us_internal_loop_update_pending_ready_polls(loop, p, 0, old_events, new_events);
}